

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

dictionary * iniparser_load(char *ininame)

{
  int iVar1;
  line_status lVar2;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  bool bVar6;
  dictionary *local_1880;
  dictionary *dict;
  int errs;
  int lineno;
  int len;
  int last;
  char val [1025];
  char local_1458 [8];
  char tmp [2049];
  char local_c48 [8];
  char key [1025];
  char local_838 [8];
  char section [1025];
  char local_428 [8];
  char line [1025];
  FILE *in;
  char *ininame_local;
  
  dict._4_4_ = 0;
  dict._0_4_ = 0;
  register0x00000000 = fopen(ininame,"r");
  if (register0x00000000 == (FILE *)0x0) {
    fprintf(_stderr,"iniparser: cannot open %s\n",ininame);
    ininame_local = (char *)0x0;
  }
  else {
    local_1880 = dictionary_new(0);
    if (local_1880 == (dictionary *)0x0) {
      fclose(stack0xffffffffffffffe0);
      ininame_local = (char *)0x0;
    }
    else {
      memset(local_428,0,0x400);
      memset(local_838,0,0x400);
      memset(local_c48,0,0x400);
      memset(&len,0,0x400);
      lineno = 0;
      do {
        while( true ) {
          do {
            pcVar3 = fgets(local_428 + lineno,0x400 - lineno,stack0xffffffffffffffe0);
            if (pcVar3 == (char *)0x0) goto LAB_0011bcf6;
            dict._4_4_ = dict._4_4_ + 1;
            sVar4 = strlen(local_428);
            errs = (int)sVar4 + -1;
          } while (errs == 0);
          if ((local_428[errs] != '\n') && (iVar1 = feof(stack0xffffffffffffffe0), iVar1 == 0)) {
            fprintf(_stderr,"iniparser: input line too long in %s (%d)\n",ininame,(ulong)dict._4_4_)
            ;
            dictionary_del(local_1880);
            fclose(stack0xffffffffffffffe0);
            return (dictionary *)0x0;
          }
          while( true ) {
            bVar6 = false;
            if ((-1 < errs) && (bVar6 = true, local_428[errs] != '\n')) {
              ppuVar5 = __ctype_b_loc();
              bVar6 = ((*ppuVar5)[(int)local_428[errs]] & 0x2000) != 0;
            }
            if (!bVar6) break;
            local_428[errs] = '\0';
            errs = errs + -1;
          }
          if (errs < 0) {
            errs = 0;
          }
          if (local_428[errs] != '\\') break;
          lineno = errs;
        }
        lVar2 = iniparser_line(local_428,local_838,local_c48,(char *)&len);
        switch(lVar2) {
        case LINE_ERROR:
          fprintf(_stderr,"iniparser: syntax error in %s (%d):\n",ininame,(ulong)dict._4_4_);
          fprintf(_stderr,"-> %s\n",local_428);
          dict._0_4_ = (int)dict + 1;
          break;
        case LINE_EMPTY:
        case LINE_COMMENT:
          break;
        case LINE_SECTION:
          dict._0_4_ = dictionary_set(local_1880,local_838,(char *)0x0);
          break;
        case LINE_VALUE:
          sprintf(local_1458,"%s:%s",local_838,local_c48);
          dict._0_4_ = dictionary_set(local_1880,local_1458,(char *)&len);
        }
        memset(local_428,0,0x400);
        lineno = 0;
      } while (-1 < (int)dict);
      fprintf(_stderr,"iniparser: memory allocation failure\n");
LAB_0011bcf6:
      if ((int)dict != 0) {
        dictionary_del(local_1880);
        local_1880 = (dictionary *)0x0;
      }
      fclose(stack0xffffffffffffffe0);
      ininame_local = (char *)local_1880;
    }
  }
  return (dictionary *)ininame_local;
}

Assistant:

dictionary * iniparser_load(const char * ininame)
{
    FILE * in ;

    char line    [ASCIILINESZ+1] ;
    char section [ASCIILINESZ+1] ;
    char key     [ASCIILINESZ+1] ;
    char tmp     [(ASCIILINESZ * 2) + 1] ;
    char val     [ASCIILINESZ+1] ;

    int  last=0 ;
    int  len ;
    int  lineno=0 ;
    int  errs=0;

    dictionary * dict ;

    if ((in=fopen(ininame, "r"))==NULL) {
        fprintf(stderr, "iniparser: cannot open %s\n", ininame);
        return NULL ;
    }

    dict = dictionary_new(0) ;
    if (!dict) {
        fclose(in);
        return NULL ;
    }

    memset(line,    0, ASCIILINESZ);
    memset(section, 0, ASCIILINESZ);
    memset(key,     0, ASCIILINESZ);
    memset(val,     0, ASCIILINESZ);
    last=0 ;

    while (fgets(line+last, ASCIILINESZ-last, in)!=NULL) {
        lineno++ ;
        len = (int)strlen(line)-1;
        if (len==0)
            continue;
        /* Safety check against buffer overflows */
        if (line[len]!='\n' && !feof(in)) {
            fprintf(stderr,
                    "iniparser: input line too long in %s (%d)\n",
                    ininame,
                    lineno);
            dictionary_del(dict);
            fclose(in);
            return NULL ;
        }
        /* Get rid of \n and spaces at end of line */
        while ((len>=0) &&
                ((line[len]=='\n') || (isspace(line[len])))) {
            line[len]=0 ;
            len-- ;
        }
        if (len < 0) { /* Line was entirely \n and/or spaces */
            len = 0;
        }
        /* Detect multi-line */
        if (line[len]=='\\') {
            /* Multi-line value */
            last=len ;
            continue ;
        } else {
            last=0 ;
        }
        switch (iniparser_line(line, section, key, val)) {
            case LINE_EMPTY:
            case LINE_COMMENT:
            break ;

            case LINE_SECTION:
            errs = dictionary_set(dict, section, NULL);
            break ;

            case LINE_VALUE:
            sprintf(tmp, "%s:%s", section, key);
            errs = dictionary_set(dict, tmp, val) ;
            break ;

            case LINE_ERROR:
            fprintf(stderr, "iniparser: syntax error in %s (%d):\n",
                    ininame,
                    lineno);
            fprintf(stderr, "-> %s\n", line);
            errs++ ;
            break;

            default:
            break ;
        }
        memset(line, 0, ASCIILINESZ);
        last=0;
        if (errs<0) {
            fprintf(stderr, "iniparser: memory allocation failure\n");
            break ;
        }
    }
    if (errs) {
        dictionary_del(dict);
        dict = NULL ;
    }
    fclose(in);
    return dict ;
}